

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void * __thiscall
v_hashmap<unsigned_long,_features>::iterator_next
          (v_hashmap<unsigned_long,_features> *this,void *prev)

{
  hash_elem *e;
  void *prev_local;
  v_hashmap<unsigned_long,_features> *this_local;
  
  if (prev != (void *)0x0) {
    for (e = (hash_elem *)((long)prev + 0x80); e != (this->dat).end_array; e = e + 1) {
      if ((e->occupied & 1U) != 0) {
        return e;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* iterator_next(void* prev)
  {
    hash_elem* e = (hash_elem*)prev;
    if (e == nullptr)
      return nullptr;
    e++;
    while (e != dat.end_array)
    {
      if (e->occupied)
        return e;
      e++;
    }
    return nullptr;
  }